

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O1

bool __thiscall simple_thread_pool::TaskHandle::execute(TaskHandle *this,TaskResult *ret)

{
  long lVar1;
  long *extraout_RDX;
  bool bVar2;
  
  LOCK();
  bVar2 = (this->status)._M_i == WAITING;
  if (bVar2) {
    (this->status)._M_i = RUNNING;
  }
  UNLOCK();
  if (bVar2) {
    if ((this->handler).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
      pthread_cond_clockwait();
      lVar1 = std::chrono::_V2::steady_clock::now();
      return *extraout_RDX <= lVar1;
    }
    (*(this->handler)._M_invoker)((_Any_data *)&this->handler,ret);
    if (this->type == ONE_TIME) {
      LOCK();
      (this->status)._M_i = DONE;
      UNLOCK();
    }
    else {
      LOCK();
      if ((this->status)._M_i == RUNNING) {
        (this->status)._M_i = WAITING;
      }
      UNLOCK();
    }
  }
  return bVar2;
}

Assistant:

bool execute(const TaskResult& ret) {
        TaskStatus exp = WAITING;
        TaskStatus desired = RUNNING;
        if (status.compare_exchange_strong(exp, desired)) {
            handler(ret);
            if (type == ONE_TIME) {
                status = DONE;
            } else {
                exp = RUNNING;
                desired = WAITING;
                status.compare_exchange_strong(exp, desired);
            }
            return true;
        }
        return false;
    }